

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper
          (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *this)

{
  DeclarationData *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  DeclarationData *pDVar4;
  
  pDVar4 = (DeclarationData *)operator_new(0x68);
  pDVar1 = (this->d).ptr;
  (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar2 = (pDVar1->property).d.d;
  (pDVar4->property).d.d = pDVar2;
  (pDVar4->property).d.ptr = (pDVar1->property).d.ptr;
  (pDVar4->property).d.size = (pDVar1->property).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar4->propertyId = pDVar1->propertyId;
  pDVar3 = (pDVar1->values).d.d;
  (pDVar4->values).d.d = pDVar3;
  (pDVar4->values).d.ptr = (pDVar1->values).d.ptr;
  (pDVar4->values).d.size = (pDVar1->values).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  ::QVariant::QVariant(&pDVar4->parsed,&pDVar1->parsed);
  pDVar4->field_0x60 = pDVar1->field_0x60;
  LOCK();
  (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pDVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pDVar1 = (this->d).ptr;
  LOCK();
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type)
       (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pDVar1 = (this->d).ptr, pDVar1 != (DeclarationData *)0x0)) {
    ::QVariant::~QVariant(&pDVar1->parsed);
    QArrayDataPointer<QCss::Value>::~QArrayDataPointer(&(pDVar1->values).d);
    pDVar2 = (pDVar1->property).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pDVar1->property).d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pDVar1,0x68);
  }
  (this->d).ptr = pDVar4;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}